

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void AddHuffmanBits(uint symbol,uint length,uchar *bp,uchar **out,size_t *outsize)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  
  for (uVar3 = length - 1; uVar3 != 0xffffffff; uVar3 = uVar3 - 1) {
    bVar2 = *bp;
    uVar4 = *outsize;
    if (bVar2 == 0) {
      if ((uVar4 & uVar4 - 1) == 0) {
        if (uVar4 == 0) {
          puVar1 = (uchar *)malloc(1);
          uVar4 = 0;
        }
        else {
          puVar1 = (uchar *)realloc(*out,uVar4 * 2);
          uVar4 = *outsize;
        }
        *out = puVar1;
      }
      else {
        puVar1 = *out;
      }
      puVar1[uVar4] = '\0';
      uVar4 = *outsize + 1;
      *outsize = uVar4;
      bVar2 = *bp;
    }
    (*out)[uVar4 - 1] = (*out)[uVar4 - 1] | ((symbol >> (uVar3 & 0x1f) & 1) != 0) << (bVar2 & 0x1f);
    *bp = *bp + 1 & 7;
  }
  return;
}

Assistant:

static void AddHuffmanBits(unsigned symbol, unsigned length,
                           unsigned char* bp, unsigned char** out,
                           size_t* outsize) {
  /* TODO(lode): make more efficient (add more bits at once). */
  unsigned i;
  for (i = 0; i < length; i++) {
    unsigned bit = (symbol >> (length - i - 1)) & 1;
    if (*bp == 0) ZOPFLI_APPEND_DATA(0, out, outsize);
    (*out)[*outsize - 1] |= bit << *bp;
    *bp = (*bp + 1) & 7;
  }
}